

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

string * __thiscall
util::encoding_name_abi_cxx11_(string *__return_storage_ptr__,util *this,codepage_id codepage)

{
  char *__s;
  ostream *poVar1;
  ostringstream oss;
  allocator<char> local_190 [376];
  
  __s = anon_unknown_0::get_encoding_name((codepage_id)this);
  if (__s == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar1 = std::operator<<((ostream *)local_190,"Windows-");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string encoding_name(codepage_id codepage) {
	
	const char * name = get_encoding_name(codepage);
	if(name) {
		return name;
	}
	
	std::ostringstream oss;
	oss << "Windows-" << codepage;
	
	return oss.str();
}